

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend-c-api.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  ulong uVar6;
  undefined8 uVar7;
  int *unaff_RBX;
  qpdf_data unaff_R14;
  qpdf_data qpdf;
  int npages;
  undefined8 local_30;
  uint local_24;
  
  uVar4 = qpdf_init();
  __s = *argv;
  local_30 = uVar4;
  pcVar5 = strrchr(__s,0x2f);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = strrchr(__s,0x5c);
    whoami = pcVar5 + 1;
    if (pcVar5 == (char *)0x0) {
      whoami = __s;
    }
  }
  else {
    whoami = pcVar5 + 1;
  }
  if (argc == 2) {
    uVar6 = qpdf_read(uVar4,argv[1],0);
    if ((uVar6 & 2) == 0) {
      uVar1 = num_pages(unaff_R14,unaff_RBX);
      if ((uVar1 & 2) == 0) {
        printf("num pages = %d\n",(ulong)local_24);
      }
    }
    iVar2 = qpdf_more_warnings(local_30);
    iVar3 = qpdf_has_error(local_30);
    uVar4 = local_30;
    if (iVar3 == 0) {
      qpdf_cleanup(&local_30);
      iVar2 = (uint)(iVar2 != 0) * 3;
    }
    else {
      uVar7 = qpdf_get_error(local_30);
      uVar4 = qpdf_get_error_full_text(uVar4,uVar7);
      printf("error: %s\n",uVar4);
      qpdf_cleanup(&local_30);
      iVar2 = 2;
    }
    return iVar2;
  }
  main_cold_1();
  halt_baddata();
}

Assistant:

int
main(int argc, char* argv[])
{
    char* infile = NULL;
    qpdf_data qpdf = qpdf_init();
    int warnings = 0;
    int errors = 0;
    char* p = NULL;

    if ((p = strrchr(argv[0], '/')) != NULL) {
        whoami = p + 1;
    } else if ((p = strrchr(argv[0], '\\')) != NULL) {
        whoami = p + 1;
    } else {
        whoami = argv[0];
    }

    if (argc != 2) {
        usage();
    }

    infile = argv[1];

    if ((qpdf_read(qpdf, infile, NULL) & QPDF_ERRORS) == 0) {
        int npages;
        if ((num_pages(qpdf, &npages) & QPDF_ERRORS) == 0) {
            printf("num pages = %d\n", npages);
        }
    }
    if (qpdf_more_warnings(qpdf)) {
        warnings = 1;
    }
    if (qpdf_has_error(qpdf)) {
        errors = 1;
        printf("error: %s\n", qpdf_get_error_full_text(qpdf, qpdf_get_error(qpdf)));
    }
    qpdf_cleanup(&qpdf);
    if (errors) {
        return 2;
    } else if (warnings) {
        return 3;
    }

    return 0;
}